

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O1

void flatbuffers::tests::MiniReflectFixedLengthArrayTest(void)

{
  uint start;
  uoffset_t root;
  string s;
  DetachedBuffer flatbuf;
  FlatBufferBuilder fbb;
  ArrayStruct aStruct;
  string local_1a8;
  string local_188;
  DetachedBuffer local_168;
  FlatBufferBuilderImpl<false> local_138;
  ArrayStruct local_b8;
  
  local_138.buf_.allocator_ = (Allocator *)0x0;
  local_138.buf_.own_allocator_ = false;
  local_138.buf_.initial_size_ = 0x400;
  local_138.buf_.max_size_ = 0x7fffffff;
  local_138.buf_.buffer_minalign_ = 8;
  local_138.buf_.reserved_ = 0;
  local_138.buf_.size_ = 0;
  local_138.length_of_64_bit_region_ = 0;
  local_138.nested = false;
  local_138.finished = false;
  local_138.buf_.buf_ = (uint8_t *)0x0;
  local_138.buf_.cur_._0_6_ = 0;
  local_138.buf_.cur_._6_2_ = 0;
  local_138.buf_.scratch_._0_6_ = 0;
  local_138._78_8_ = 0;
  local_138.minalign_ = 1;
  local_138.force_defaults_ = false;
  local_138.dedup_vtables_ = true;
  local_138.string_pool = (StringOffsetMap *)0x0;
  local_b8.a_ = 2.0;
  local_b8.b_[0] = 0;
  local_b8.b_[1] = 0;
  local_b8.b_[2] = 0;
  local_b8.b_[3] = 0;
  local_b8.b_[4] = 0;
  local_b8.b_[5] = 0;
  local_b8.b_[6] = 0;
  local_b8.b_[7] = 0;
  local_b8.b_[8] = 0;
  local_b8.b_[9] = 0;
  local_b8.b_[10] = 0;
  local_b8.b_[0xb] = 0;
  local_b8.b_[0xc] = 0;
  local_b8.b_[0xd] = 0;
  local_b8.b_[0xe] = 0;
  local_b8.c_ = '\f';
  local_b8._65_8_ = 0;
  local_b8.d_[0]._1_8_ = 0;
  local_b8.d_[0]._9_8_ = 0;
  local_b8.d_[0].d_._1_8_ = 0;
  local_b8.d_._25_8_ = 0;
  local_b8.d_[1]._1_8_ = 0;
  local_b8.d_[1]._9_8_ = 0;
  local_b8.d_[1].d_[0]._1_7_ = 0;
  local_b8.d_[1].d_[1]._0_1_ = 0;
  local_b8.d_[1].d_[1]._1_7_ = 0;
  local_b8.e_ = 1;
  local_b8._140_8_ = 0;
  local_b8.f_._4_8_ = 0;
  local_b8.f_[1]._4_4_ = 0;
  FlatBufferBuilderImpl<false>::NotNested(&local_138);
  start = local_138.buf_.size_;
  local_138.nested = true;
  FlatBufferBuilderImpl<false>::AddStruct<MyGame::Example::ArrayStruct>(&local_138,4,&local_b8);
  root = FlatBufferBuilderImpl<false>::EndTable(&local_138,start);
  FlatBufferBuilderImpl<false>::Finish(&local_138,root,(char *)0x0,false);
  FlatBufferBuilderImpl<false>::Release(&local_168,&local_138);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
  FlatBufferToString(&local_188,local_168.cur_,
                     (TypeTable *)MyGame::Example::ArrayTableTypeTable()::tt,false,true,&local_1a8,
                     false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  TestEqStr("{ a: { a: 2.0, b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], c: 12, d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], e: 1, f: [ 0, 0 ] } }"
            ,local_188._M_dataplus._M_p,
            "\'\"{ \" \"a: { a: 2.0, \" \"b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], \" \"c: 12, \" \"d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, \" \"{ a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], \" \"e: 1, f: [ 0, 0 ] } \" \"}\"\' != \'s.c_str()\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x142,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  DetachedBuffer::~DetachedBuffer(&local_168);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_138);
  return;
}

Assistant:

void MiniReflectFixedLengthArrayTest() {
  // VS10 does not support typed enums, exclude from tests
#if !defined(_MSC_VER) || _MSC_VER >= 1700
  flatbuffers::FlatBufferBuilder fbb;
  MyGame::Example::ArrayStruct aStruct(2, 12, 1);
  auto aTable = MyGame::Example::CreateArrayTable(fbb, &aStruct);
  fbb.Finish(aTable);

  auto flatbuf = fbb.Release();
  auto s = flatbuffers::FlatBufferToString(
      flatbuf.data(), MyGame::Example::ArrayTableTypeTable());
  TEST_EQ_STR(
      "{ "
      "a: { a: 2.0, "
      "b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], "
      "c: 12, "
      "d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, "
      "{ a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], "
      "e: 1, f: [ 0, 0 ] } "
      "}",
      s.c_str());
#endif
}